

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Loop.H
# Opt level: O0

void amrex::
     LoopConcurrentOnCpu<amrex::MLNodeLaplacian::interpolation(int,int,amrex::MultiFab&,amrex::MultiFab_const&)const::__4>
               (Box *bx,anon_class_40_5_043eac4b *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  anon_class_40_5_043eac4b *in_RDI;
  int i;
  int j;
  int k;
  Dim3 hi;
  Dim3 lo;
  int local_104;
  int local_100;
  int local_fc;
  int k_00;
  int j_00;
  int in_stack_ffffffffffffff64;
  
  iVar1 = *(int *)&in_RDI->ffab;
  iVar2 = *(int *)((long)&in_RDI->ffab + 4);
  iVar3 = *(int *)((long)&in_RDI->cfab + 4);
  iVar4 = *(int *)&in_RDI->sfab;
  iVar5 = *(int *)((long)&in_RDI->sfab + 4);
  local_fc = *(int *)&in_RDI->cfab;
  j_00 = local_fc;
  k_00 = iVar2;
  for (; local_100 = iVar2, local_fc <= iVar5; local_fc = local_fc + 1) {
    for (; local_104 = iVar1, local_100 <= iVar4; local_100 = local_100 + 1) {
      for (; local_104 <= iVar3; local_104 = local_104 + 1) {
        MLNodeLaplacian::interpolation::anon_class_40_5_043eac4b::operator()
                  (in_RDI,in_stack_ffffffffffffff64,j_00,k_00);
      }
    }
  }
  return;
}

Assistant:

void LoopConcurrentOnCpu (Box const& bx, F&& f) noexcept
{
    const auto lo = amrex::lbound(bx);
    const auto hi = amrex::ubound(bx);
    for (int k = lo.z; k <= hi.z; ++k) {
    for (int j = lo.y; j <= hi.y; ++j) {
    AMREX_PRAGMA_SIMD
    for (int i = lo.x; i <= hi.x; ++i) {
        f(i,j,k);
    }}}
}